

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O2

PC * __thiscall Hpipe::Context::without_mark(PC *__return_storage_ptr__,Context *this)

{
  pointer ppCVar1;
  uint ind;
  PcMaker pm;
  PcMaker local_b0;
  
  anon_unknown_7::PcMaker::PcMaker(&local_b0,this);
  ind = 0;
  while( true ) {
    ppCVar1 = (this->pos).
              super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
              super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->pos).
                      super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                      .
                      super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar1 >> 3) <= (ulong)ind
       ) break;
    anon_unknown_7::PcMaker::add(&local_b0,ppCVar1[ind],ind,false);
    ind = ind + 1;
  }
  local_b0.res.first.flags._0_1_ = (byte)local_b0.res.first.flags | 8;
  local_b0.res.first.mark = (InstructionMark *)0x0;
  std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::pair(__return_storage_ptr__,&local_b0.res);
  std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::~pair(&local_b0.res);
  return __return_storage_ptr__;
}

Assistant:

Context::PC Context::without_mark() const { //  const Vec<unsigned> &keep_ind
    PcMaker pm( this );

    //if ( keep_ind.contains( i ) )
    for( unsigned i = 0; i < pos.size(); ++i )
        pm.add( pos[ i ], i, false );

    pm.res.first.flags |= FL_OK;
    pm.res.first.mark = nullptr;
    return pm.out();
}